

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathGeneratorAdapterTests::PathIteratorRewoundOnStart(PathGeneratorAdapterTests *this)

{
  ulong uVar1;
  ulong uVar2;
  allocator local_d9;
  mock_path_sink s;
  path p;
  string local_a0;
  path local_80;
  LocationInfo local_60;
  point input [3];
  
  input[1].y = 23.0;
  input[1].command = 2;
  input[2].x = 3.0;
  input[2].y = 7.0;
  input[0].x = 10.0;
  input[0].y = 13.0;
  input[0].command = 1;
  input[1].x = 11.0;
  input[2].command = 2;
  mocks::path::path<agge::tests::mocks::path::point,3ul>(&p,&input);
  s.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  s.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = ((long)p.points.
                 super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)p.points.
                super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  uVar2 = p.position + (p.position < uVar1);
  if (p.position < uVar1 || uVar2 < uVar1) {
    p.position = uVar2 + (uVar2 < uVar1);
  }
  mocks::path::path(&local_80,&p);
  add_path<agge::tests::PathGeneratorAdapterTests::mock_path_sink,agge::tests::mocks::path>
            (&s,&local_80);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&local_80);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_d9);
  ut::LocationInfo::LocationInfo(&local_60,&local_a0,0x174);
  ut::
  are_equal<agge::tests::mocks::path::point,3ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            (&input,&s.points,&local_60);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&s);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&p);
  return;
}

Assistant:

test( PathIteratorRewoundOnStart )
			{
				// INIT
				mocks::path::point input[] = {
					{ 10.0f, 13.0f, path_command_move_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 3.0f, 7.0f, path_command_line_to },
				};
				mocks::path p(input);
				mock_path_sink s;
				real_t dummy;

				p.vertex(&dummy, &dummy);
				p.vertex(&dummy, &dummy);

				// ACT
				add_path(s, p);

				// ASSERT
				assert_equal(input, s.points);
			}